

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O1

void mi_random_init_ex(mi_random_ctx_t *ctx,_Bool use_weak)

{
  _Bool _Var1;
  uint8_t *sigma;
  ulong uVar2;
  undefined7 in_register_00000031;
  size_t i;
  long lVar3;
  uint8_t key [32];
  uint32_t local_38 [8];
  
  if ((int)CONCAT71(in_register_00000031,use_weak) == 0) {
    _Var1 = _mi_prim_random_buf(local_38,0x20);
    if (_Var1) {
      _Var1 = false;
      goto LAB_004620f3;
    }
    if (!use_weak) {
      _mi_warning_message("unable to use secure randomness\n");
    }
  }
  lVar3 = 0;
  uVar2 = _mi_os_random_weak(0);
  do {
    if (uVar2 == 0) {
      uVar2 = 0x11;
    }
    uVar2 = (uVar2 >> 0x1e ^ uVar2) * -0x40a7b892e31b1a47;
    uVar2 = (uVar2 >> 0x1b ^ uVar2) * -0x6b2fb644ecceee15;
    uVar2 = uVar2 >> 0x1f ^ uVar2;
    local_38[lVar3] = (uint32_t)uVar2;
    lVar3 = lVar3 + 1;
    uVar2 = uVar2 + 1;
  } while (lVar3 != 8);
  _Var1 = true;
LAB_004620f3:
  ctx->weak = _Var1;
  lVar3 = 0;
  memset(ctx,0,0x88);
  do {
    ctx->input[lVar3] = *(uint32_t *)("expand 32-byte k" + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  lVar3 = 0;
  do {
    ctx->input[lVar3 + 4] = local_38[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  ctx->input[0xc] = 0;
  ctx->input[0xd] = 0;
  *(mi_random_ctx_t **)(ctx->input + 0xe) = ctx;
  return;
}

Assistant:

static void mi_random_init_ex(mi_random_ctx_t* ctx, bool use_weak) {
  uint8_t key[32];
  if (use_weak || !_mi_prim_random_buf(key, sizeof(key))) {
    // if we fail to get random data from the OS, we fall back to a
    // weak random source based on the current time
    #if !defined(__wasi__)
    if (!use_weak) { _mi_warning_message("unable to use secure randomness\n"); }
    #endif
    uintptr_t x = _mi_os_random_weak(0);
    for (size_t i = 0; i < 8; i++, x++) {  // key is eight 32-bit words.
      x = _mi_random_shuffle(x);
      ((uint32_t*)key)[i] = (uint32_t)x;
    }
    ctx->weak = true;
  }
  else {
    ctx->weak = false;
  }
  chacha_init(ctx, key, (uintptr_t)ctx /*nonce*/ );
}